

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O2

bool __thiscall
duckdb::Binder::TryFindBinding
          (Binder *this,string *using_column,string *join_side,BindingAlias *result)

{
  Binding *this_00;
  pointer prVar1;
  pointer prVar2;
  bool bVar3;
  BinderException *this_01;
  pointer prVar4;
  string error;
  vector<std::reference_wrapper<duckdb::Binding>,_true> bindings;
  string local_50;
  
  BindContext::GetMatchingBindings(&bindings,&this->bind_context,using_column);
  prVar2 = bindings.
           super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  prVar1 = bindings.
           super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar4 = bindings.
           super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bindings.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      bindings.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (; prVar4 != prVar2; prVar4 = prVar4 + 1) {
      bVar3 = BindingAlias::IsSet(result);
      if (bVar3) {
        ::std::__cxx11::string::string((string *)&error,"Column name \"",(allocator *)&local_50);
        ::std::__cxx11::string::append((string *)&error);
        ::std::__cxx11::string::append((char *)&error);
        ::std::__cxx11::string::append((string *)&error);
        ::std::__cxx11::string::append((char *)&error);
        for (; bindings.
               super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               bindings.
               super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            bindings.
            super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 bindings.
                 super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          this_00 = (bindings.
                     super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_data;
          ::std::__cxx11::string::append((char *)&error);
          Binding::GetAlias_abi_cxx11_(&local_50,this_00);
          ::std::__cxx11::string::append((string *)&error);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::append((char *)&error);
          BindContext::GetActualColumnName(&local_50,&this->bind_context,this_00,using_column);
          ::std::__cxx11::string::append((string *)&error);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        BinderException::BinderException(this_01,&error);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      BindingAlias::operator=(result,&prVar4->_M_data->alias);
    }
  }
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                   *)&bindings);
  return prVar1 != prVar2;
}

Assistant:

bool Binder::TryFindBinding(const string &using_column, const string &join_side, BindingAlias &result) {
	// for each using column, get the matching binding
	auto bindings = bind_context.GetMatchingBindings(using_column);
	if (bindings.empty()) {
		return false;
	}
	// find the join binding
	for (auto &binding : bindings) {
		if (result.IsSet()) {
			string error = "Column name \"";
			error += using_column;
			error += "\" is ambiguous: it exists more than once on ";
			error += join_side;
			error += " side of join.\nCandidates:";
			for (auto &binding_ref : bindings) {
				auto &other_binding = binding_ref.get();
				error += "\n\t";
				error += other_binding.GetAlias();
				error += ".";
				error += bind_context.GetActualColumnName(other_binding, using_column);
			}
			throw BinderException(error);
		} else {
			result = binding.get().alias;
		}
	}
	return true;
}